

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O2

record_info_s * record_info_for_database(record_info_s *__return_storage_ptr__,MMDB_s *mmdb)

{
  int iVar1;
  _func_uint32_t_uint8_t_ptr *p_Var2;
  uint uVar3;
  ulong uVar4;
  
  __return_storage_ptr__->right_record_getter = (_func_uint32_t_uint8_t_ptr *)0x0;
  *(undefined8 *)&__return_storage_ptr__->right_record_offset = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  __return_storage_ptr__->left_record_getter = (_func_uint32_t_uint8_t_ptr *)0x0;
  iVar1 = *(int *)&mmdb->full_record_byte_size;
  __return_storage_ptr__->record_length = (uint16_t)iVar1;
  uVar3 = iVar1 - 6;
  if ((ushort)uVar3 < 3) {
    uVar4 = (ulong)((uVar3 & 0xffff) << 3);
    p_Var2 = *(_func_uint32_t_uint8_t_ptr **)((long)&PTR_get_uint24_00109dc8 + uVar4);
    __return_storage_ptr__->left_record_getter =
         *(_func_uint32_t_uint8_t_ptr **)((long)&PTR_get_uint24_00109db0 + uVar4);
    __return_storage_ptr__->right_record_getter = p_Var2;
    __return_storage_ptr__->right_record_offset = (uint8_t)(0x40303 >> ((char)uVar3 * '\b' & 0x1fU))
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

static record_info_s record_info_for_database(const MMDB_s *const mmdb) {
    record_info_s record_info = {.record_length = mmdb->full_record_byte_size,
                                 .right_record_offset = 0};

    if (record_info.record_length == 6) {
        record_info.left_record_getter = &get_uint24;
        record_info.right_record_getter = &get_uint24;
        record_info.right_record_offset = 3;
    } else if (record_info.record_length == 7) {
        record_info.left_record_getter = &get_left_28_bit_record;
        record_info.right_record_getter = &get_right_28_bit_record;
        record_info.right_record_offset = 3;
    } else if (record_info.record_length == 8) {
        record_info.left_record_getter = &get_uint32;
        record_info.right_record_getter = &get_uint32;
        record_info.right_record_offset = 4;
    }

    // Callers must check that right_record_offset is non-zero in case none of
    // the above conditions matched.

    return record_info;
}